

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
pbrt::Tokenizer::CreateFromString
          (string *str,function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  std::
  make_unique<pbrt::Tokenizer,std::__cxx11::string,std::function<void(char_const*,pbrt::FileLoc_const*)>>
            (str,errorCallback);
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)str;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromString(
    std::string str, std::function<void(const char *, const FileLoc *)> errorCallback) {
    return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
}